

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_write_disk_symlink.c
# Opt level: O0

void test_write_disk_symlink(void)

{
  wchar_t wVar1;
  archive_entry *paVar2;
  archive_entry *paVar3;
  archive_entry *paVar4;
  void *in_stack_00000010;
  int r;
  archive_entry *ae;
  archive *ad;
  undefined4 in_stack_00000070;
  wchar_t in_stack_00000074;
  char *in_stack_00000078;
  wchar_t in_stack_00000084;
  char *in_stack_00000088;
  archive_entry *in_stack_ffffffffffffffd8;
  char *path;
  undefined4 in_stack_ffffffffffffffe0;
  wchar_t in_stack_ffffffffffffffe4;
  wchar_t in_stack_ffffffffffffffe8;
  wchar_t in_stack_ffffffffffffffec;
  char *in_stack_fffffffffffffff0;
  wchar_t wVar5;
  
  wVar1 = canSymlink();
  if (wVar1 == L'\0') {
    skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_disk_symlink.c"
                   ,L'\'');
    test_skipping("Symlinks not supported");
  }
  else {
    paVar2 = (archive_entry *)archive_write_disk_new();
    assertion_assert(in_stack_fffffffffffffff0,in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8,
                     (char *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                     in_stack_ffffffffffffffd8);
    paVar3 = archive_entry_new();
    assertion_assert((char *)paVar3,in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8,
                     (char *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                     in_stack_ffffffffffffffd8);
    archive_entry_copy_pathname
              ((archive_entry *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
               (char *)in_stack_ffffffffffffffd8);
    archive_entry_set_mode(paVar3,0x81ed);
    archive_entry_set_size(paVar3,0x1b);
    wVar1 = (wchar_t)((ulong)paVar3 >> 0x20);
    archive_write_header
              ((archive *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
               in_stack_ffffffffffffffd8);
    paVar3 = paVar2;
    assertion_equal_int((char *)paVar2,wVar1,
                        CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
                        (char *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                        (longlong)paVar2,(char *)0x1d3eb5,in_stack_00000010);
    archive_write_data((archive *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                       paVar2,0x1d3ecb);
    assertion_equal_int((char *)paVar3,wVar1,
                        CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
                        (char *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),0,
                        (char *)0x1d3efc,in_stack_00000010);
    archive_write_finish_entry((archive *)0x1d3f06);
    paVar2 = paVar3;
    assertion_equal_int((char *)paVar3,wVar1,
                        CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
                        (char *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                        (longlong)paVar3,(char *)0x1d3f35,in_stack_00000010);
    archive_entry_free((archive_entry *)0x1d3f3f);
    paVar4 = archive_entry_new();
    assertion_assert((char *)paVar4,in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8,
                     (char *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),paVar3);
    archive_entry_copy_pathname
              ((archive_entry *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
               (char *)paVar3);
    archive_entry_set_mode(paVar4,0xa1a2);
    archive_entry_set_size(paVar4,0);
    wVar5 = (wchar_t)((ulong)paVar4 >> 0x20);
    archive_entry_copy_symlink
              ((archive_entry *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
               (char *)paVar3);
    wVar1 = archive_write_header
                      ((archive *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                       paVar3);
    paVar3 = paVar2;
    assertion_equal_int((char *)paVar2,wVar5,CONCAT44(wVar1,in_stack_ffffffffffffffe8),
                        (char *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                        (longlong)paVar2,(char *)0x1d3ff3,in_stack_00000010);
    if (L'\xffffffeb' < wVar1) {
      paVar2 = paVar3;
      archive_write_finish_entry((archive *)0x1d4004);
      paVar3 = paVar2;
      assertion_equal_int((char *)paVar2,wVar5,CONCAT44(wVar1,in_stack_ffffffffffffffe8),
                          (char *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                          (longlong)paVar2,(char *)0x1d4033,in_stack_00000010);
    }
    archive_entry_free((archive_entry *)0x1d403d);
    paVar4 = archive_entry_new();
    assertion_assert((char *)paVar4,wVar1,in_stack_ffffffffffffffe8,
                     (char *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),paVar2);
    archive_entry_copy_pathname
              ((archive_entry *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
               (char *)paVar2);
    archive_entry_set_mode(paVar4,0xa1a2);
    wVar5 = (wchar_t)((ulong)paVar4 >> 0x20);
    archive_entry_unset_size((archive_entry *)0x1d409a);
    archive_entry_copy_symlink
              ((archive_entry *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
               (char *)paVar2);
    wVar1 = archive_write_header
                      ((archive *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                       paVar2);
    paVar2 = paVar3;
    assertion_equal_int((char *)paVar3,wVar5,CONCAT44(wVar1,in_stack_ffffffffffffffe8),
                        (char *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                        (longlong)paVar3,(char *)0x1d40ed,in_stack_00000010);
    if (L'\xffffffeb' < wVar1) {
      archive_write_data((archive *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                         paVar3,0x1d410e);
      assertion_equal_int((char *)paVar2,wVar5,CONCAT44(wVar1,in_stack_ffffffffffffffe8),
                          (char *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),0,
                          (char *)0x1d4141,in_stack_00000010);
      paVar3 = paVar2;
      archive_write_finish_entry((archive *)0x1d414b);
      paVar2 = paVar3;
      assertion_equal_int((char *)paVar3,wVar5,CONCAT44(wVar1,in_stack_ffffffffffffffe8),
                          (char *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                          (longlong)paVar3,(char *)0x1d417a,in_stack_00000010);
    }
    archive_entry_free((archive_entry *)0x1d4184);
    paVar4 = archive_entry_new();
    assertion_assert((char *)paVar4,wVar1,in_stack_ffffffffffffffe8,
                     (char *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),paVar3);
    archive_entry_copy_pathname
              ((archive_entry *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
               (char *)paVar3);
    archive_entry_set_mode(paVar4,0x81ed);
    archive_entry_set_size(paVar4,0x1b);
    wVar5 = (wchar_t)((ulong)paVar4 >> 0x20);
    archive_write_header
              ((archive *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),paVar3);
    paVar3 = paVar2;
    assertion_equal_int((char *)paVar2,wVar5,CONCAT44(wVar1,in_stack_ffffffffffffffe8),
                        (char *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                        (longlong)paVar2,(char *)0x1d4224,in_stack_00000010);
    archive_write_data((archive *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                       paVar2,0x1d423a);
    assertion_equal_int((char *)paVar3,wVar5,CONCAT44(wVar1,in_stack_ffffffffffffffe8),
                        (char *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),0,
                        (char *)0x1d426b,in_stack_00000010);
    archive_write_finish_entry((archive *)0x1d4275);
    assertion_equal_int((char *)paVar3,wVar5,CONCAT44(wVar1,in_stack_ffffffffffffffe8),
                        (char *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                        (longlong)paVar3,(char *)0x1d42a4,in_stack_00000010);
    archive_entry_free((archive_entry *)0x1d42ae);
    archive_write_free((archive *)0x1d42b8);
    path = (char *)0x0;
    assertion_equal_int((char *)paVar3,wVar5,CONCAT44(wVar1,in_stack_ffffffffffffffe8),
                        (char *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),0,
                        (char *)0x1d42e6,in_stack_00000010);
    assertion_is_reg(in_stack_00000088,in_stack_00000084,in_stack_00000078,in_stack_00000074);
    assertion_file_size(in_stack_00000088,in_stack_00000084,in_stack_00000078,
                        CONCAT44(in_stack_00000074,in_stack_00000070));
    assertion_file_nlinks(in_stack_00000088,in_stack_00000084,in_stack_00000078,in_stack_00000074);
    assertion_is_symlink
              ((char *)CONCAT44(wVar1,in_stack_ffffffffffffffe8),in_stack_ffffffffffffffe4,path,
               (char *)0x1d435c);
    assertion_is_reg(in_stack_00000088,in_stack_00000084,in_stack_00000078,in_stack_00000074);
    assertion_file_size(in_stack_00000088,in_stack_00000084,in_stack_00000078,
                        CONCAT44(in_stack_00000074,in_stack_00000070));
    assertion_file_nlinks(in_stack_00000088,in_stack_00000084,in_stack_00000078,in_stack_00000074);
    assertion_is_symlink
              ((char *)CONCAT44(wVar1,in_stack_ffffffffffffffe8),in_stack_ffffffffffffffe4,path,
               (char *)0x1d43d2);
  }
  return;
}

Assistant:

DEFINE_TEST(test_write_disk_symlink)
{
	static const char data[]="abcdefghijklmnopqrstuvwxyz";
	struct archive *ad;
	struct archive_entry *ae;
	int r;

	if (!canSymlink()) {
		skipping("Symlinks not supported");
		return;
	}

	/* Write entries to disk. */
	assert((ad = archive_write_disk_new()) != NULL);

	/*
	 * First, create a regular file then a symlink to that file.
	 */

	/* Regular file: link1a */
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_copy_pathname(ae, "link1a");
	archive_entry_set_mode(ae, AE_IFREG | 0755);
	archive_entry_set_size(ae, sizeof(data));
	assertEqualIntA(ad, 0, archive_write_header(ad, ae));
	assertEqualInt(sizeof(data),
	    archive_write_data(ad, data, sizeof(data)));
	assertEqualIntA(ad, 0, archive_write_finish_entry(ad));
	archive_entry_free(ae);

	/* Symbolic Link: link1b -> link1a */
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_copy_pathname(ae, "link1b");
	archive_entry_set_mode(ae, AE_IFLNK | 0642);
	archive_entry_set_size(ae, 0);
	archive_entry_copy_symlink(ae, "link1a");
	assertEqualIntA(ad, 0, r = archive_write_header(ad, ae));
	if (r >= ARCHIVE_WARN)
		assertEqualIntA(ad, 0, archive_write_finish_entry(ad));
	archive_entry_free(ae);

	/*
	 * We should be able to do this in the other order as well,
	 * of course.
	 */

	/* Symbolic link: link2b -> link2a */
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_copy_pathname(ae, "link2b");
	archive_entry_set_mode(ae, AE_IFLNK | 0642);
	archive_entry_unset_size(ae);
	archive_entry_copy_symlink(ae, "link2a");
	assertEqualIntA(ad, 0, r = archive_write_header(ad, ae));
	if (r >= ARCHIVE_WARN) {
		assertEqualInt(ARCHIVE_WARN,
		    archive_write_data(ad, data, sizeof(data)));
		assertEqualIntA(ad, 0, archive_write_finish_entry(ad));
	}
	archive_entry_free(ae);

	/* File: link2a */
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_copy_pathname(ae, "link2a");
	archive_entry_set_mode(ae, AE_IFREG | 0755);
	archive_entry_set_size(ae, sizeof(data));
	assertEqualIntA(ad, 0, archive_write_header(ad, ae));
	assertEqualInt(sizeof(data),
	    archive_write_data(ad, data, sizeof(data)));
	assertEqualIntA(ad, 0, archive_write_finish_entry(ad));
	archive_entry_free(ae);

	assertEqualInt(ARCHIVE_OK, archive_write_free(ad));

	/* Test the entries on disk. */

	/* Test #1 */
	assertIsReg("link1a", -1);
	assertFileSize("link1a", sizeof(data));
	assertFileNLinks("link1a", 1);
	assertIsSymlink("link1b", "link1a");

	/* Test #2: Should produce identical results to test #1 */
	assertIsReg("link2a", -1);
	assertFileSize("link2a", sizeof(data));
	assertFileNLinks("link2a", 1);
	assertIsSymlink("link2b", "link2a");
}